

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcaf_grammar_repeat(int n,mpc_val_t **xs)

{
  int n_00;
  int num;
  mpc_val_t **xs_local;
  mpc_parser_t *pmStack_10;
  int n_local;
  
  if (xs[1] == (mpc_val_t *)0x0) {
    pmStack_10 = (mpc_parser_t *)*xs;
  }
  else {
    switch(*xs[1]) {
    case 0x21:
      free(xs[1]);
      pmStack_10 = mpca_not((mpc_parser_t *)*xs);
      break;
    default:
      n_00 = *xs[1];
      free(xs[1]);
      pmStack_10 = mpca_count(n_00,(mpc_parser_t *)*xs);
      break;
    case 0x2a:
      free(xs[1]);
      pmStack_10 = mpca_many((mpc_parser_t *)*xs);
      break;
    case 0x2b:
      free(xs[1]);
      pmStack_10 = mpca_many1((mpc_parser_t *)*xs);
      break;
    case 0x3f:
      free(xs[1]);
      pmStack_10 = mpca_maybe((mpc_parser_t *)*xs);
    }
  }
  return pmStack_10;
}

Assistant:

static mpc_val_t *mpcaf_grammar_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpca_many(xs[0]); }; break;
    case '+': { free(xs[1]); return mpca_many1(xs[0]); }; break;
    case '?': { free(xs[1]); return mpca_maybe(xs[0]); }; break;
    case '!': { free(xs[1]); return mpca_not(xs[0]); }; break;
    default:
      num = *((int*)xs[1]);
      free(xs[1]);
  }
  return mpca_count(num, xs[0]);
}